

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_http.c
# Opt level: O0

void oonf_http_add(oonf_http_handler *handler)

{
  char *pcVar1;
  size_t sVar2;
  oonf_http_handler *handler_local;
  
  pcVar1 = handler->site;
  sVar2 = strlen(handler->site);
  handler->directory = pcVar1[sVar2 - 1] == '/';
  (handler->node).key = handler->site;
  avl_insert(&_http_site_tree,handler);
  if (((&log_global_mask)[_oonf_http_subsystem.logging] & 1) != 0) {
    oonf_log(1,_oonf_http_subsystem.logging,"src/base/oonf_http.c",0xfb,0,0,
             "Added http handler for uri: %s",handler->site);
  }
  return;
}

Assistant:

void
oonf_http_add(struct oonf_http_handler *handler) {
  handler->directory = handler->site[strlen(handler->site) - 1] == '/';
  handler->node.key = handler->site;
  avl_insert(&_http_site_tree, &handler->node);

  OONF_DEBUG(LOG_HTTP, "Added http handler for uri: %s", handler->site);
}